

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  undefined8 unaff_RBX;
  undefined1 (*pauVar3) [16];
  void *pvVar4;
  undefined4 in_register_00000084;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  uchar px [3];
  uchar arr [3];
  undefined1 local_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 uStack_28;
  undefined1 uStack_27;
  undefined1 auStack_26 [14];
  
  auStack_26._6_4_ = (undefined4)unaff_RBX;
  auStack_26._10_4_ = (undefined4)((ulong)unaff_RBX >> 0x20);
  pauVar1 = (undefined1 (*) [16])CONCAT44(in_register_00000084,expand_mono);
  if (rgb_dir - 1U < 2) {
    if (write_alpha != 0) {
      uStack_29 = (*pauVar1)[0];
      pauVar3 = (undefined1 (*) [16])&uStack_29;
      uStack_28 = uStack_29;
      uStack_27 = uStack_29;
      goto LAB_00176aaa;
    }
    pvVar4 = s->context;
    iVar2 = 1;
    pauVar3 = pauVar1;
  }
  else {
    if (rgb_dir == 3) {
LAB_00176a7c:
      uStack_2a = (*pauVar1)[2];
      local_2c = (*pauVar1)[0];
      uStack_2b = (*pauVar1)[1];
      pauVar3 = (undefined1 (*) [16])(auStack_26 + 3);
    }
    else {
      if (rgb_dir != 4) goto LAB_00176ab8;
      if (comp != 0) goto LAB_00176a7c;
      auVar6 = vpbroadcastd_avx512f();
      auVar5 = vmovdqu8_avx512vl(*pauVar1);
      auVar7 = vpmovzxbd_avx512f(ZEXT316(auVar5._0_3_));
      auVar7 = vpaddd_avx512f(auVar7,_DAT_001c9dc0);
      auVar6 = vpmulld_avx512f(auVar7,auVar6);
      auVar7 = vpbroadcastd_avx512f(ZEXT416(0x80808081));
      auVar8 = vpmuldq_avx512f(auVar6,auVar7);
      auVar9 = vpshufd_avx512f(auVar6,0xf5);
      auVar7 = vpmuldq_avx512f(auVar9,auVar7);
      auVar9 = vpmovsxbd_avx512f(_DAT_001cc2e0);
      auVar7 = vpermi2d_avx512f(auVar9,auVar8,auVar7);
      auVar6 = vpaddd_avx512f(auVar7,auVar6);
      auVar7 = vpsrld_avx512f(auVar6,0x1f);
      auVar6 = vpsrld_avx512f(auVar6,7);
      auVar6 = vpaddd_avx512f(auVar6,auVar7);
      auVar5 = vpmovdb_avx512f(auVar6);
      auVar5 = vpaddb_avx(auVar5,_DAT_001cc350);
      auVar5 = vmovdqu8_avx512vl(auVar5);
      local_2c = auVar5[0];
      uStack_2b = auVar5[1];
      uStack_2a = auVar5[2];
      uStack_29 = auVar5[3];
      uStack_28 = auVar5[4];
      uStack_27 = auVar5[5];
      auStack_26._0_6_ = auVar5._6_6_;
      auStack_26._6_4_ = auVar5._12_4_;
      pauVar3 = (undefined1 (*) [16])auStack_26;
    }
    (*pauVar3)[0] = uStack_2a;
    (*pauVar3)[1] = uStack_2b;
    (*pauVar3)[2] = local_2c;
LAB_00176aaa:
    pvVar4 = s->context;
    iVar2 = 3;
  }
  (*s->func)(pvVar4,pauVar3,iVar2);
LAB_00176ab8:
  if (0 < comp) {
    (*s->func)(s->context,pauVar1[-1] + (long)rgb_dir + 0xf,1);
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      s->func(s->context, &d[comp - 1], 1);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            s->func(s->context, d, 1);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      s->func(s->context, &d[comp - 1], 1);
}